

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cpp
# Opt level: O3

string * fs_as_posix_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  size_type sVar1;
  pointer pcVar2;
  _Bool _Var3;
  size_type sVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,path._M_str,path._M_str + path._M_len);
  _Var3 = fs_is_windows();
  if ((_Var3) && (sVar1 = __return_storage_ptr__->_M_string_length, sVar1 != 0)) {
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      if (pcVar2[sVar4] == '\\') {
        pcVar2[sVar4] = '/';
      }
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fs_as_posix(std::string_view path)
{
  std::string s(path);

  if(fs_is_windows())
    std::replace(s.begin(), s.end(), '\\', '/');

  return s;
}